

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_head_multiple.h
# Opt level: O0

void density::detail::swap
               (LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
                *i_first,
               LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
               *i_second)

{
  __pointer_type __p;
  __pointer_type __p_00;
  __pointer_type tmp;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  *i_second_local;
  LFQueue_Head<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_density::detail::LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>_>
  *i_first_local;
  
  swap(&i_first->
        super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
       ,&i_second->
         super_LFQueue_Tail<density::runtime_type<>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::consistency_model)0>
      );
  __p = std::atomic<density::detail::LfQueueControl_*>::load(&i_second->m_head,memory_order_seq_cst)
  ;
  __p_00 = std::atomic<density::detail::LfQueueControl_*>::load
                     (&i_first->m_head,memory_order_seq_cst);
  std::atomic<density::detail::LfQueueControl_*>::store
            (&i_second->m_head,__p_00,memory_order_seq_cst);
  std::atomic<density::detail::LfQueueControl_*>::store(&i_first->m_head,__p,memory_order_seq_cst);
  return;
}

Assistant:

void swap(LFQueue_Head & i_first, LFQueue_Head & i_second) noexcept
            {
                // swap the base
                swap(static_cast<Base &>(i_first), static_cast<Base &>(i_second));

                // swap the head
                auto const tmp = i_second.m_head.load();
                i_second.m_head.store(i_first.m_head.load());
                i_first.m_head.store(tmp);
            }